

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O3

void octaveInitBeta(OctaveNoise *noise,uint64_t *seed,PerlinNoise *octaves,int octcnt,double lac,
                   double lacMul,double persist,double persistMul)

{
  ulong uVar1;
  PerlinNoise *noise_00;
  
  if (0 < octcnt) {
    uVar1 = (ulong)(uint)octcnt;
    noise_00 = octaves;
    do {
      perlinInit(noise_00,seed);
      noise_00->amplitude = persist;
      noise_00->lacunarity = lac;
      persist = persist * persistMul;
      lac = lac * lacMul;
      noise_00 = noise_00 + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  noise->octaves = octaves;
  noise->octcnt = octcnt;
  return;
}

Assistant:

void octaveInitBeta(OctaveNoise *noise, uint64_t *seed, PerlinNoise *octaves,
    int octcnt, double lac, double lacMul, double persist, double persistMul)
{
    int i;
    for (i = 0; i < octcnt; i++)
    {
        perlinInit(&octaves[i], seed);
        octaves[i].amplitude = persist;
        octaves[i].lacunarity = lac;
        persist *= persistMul;
        lac *= lacMul;
    }
    noise->octaves = octaves;
    noise->octcnt = octcnt;
}